

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O3

SH<15> * log_visibility(SH<15> *__return_storage_ptr__,vec3f cluster_center,
                       vector<Sphere,_std::allocator<Sphere>_> *blockers)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pSVar3;
  undefined8 uVar4;
  int i_1;
  int iVar5;
  long lVar6;
  SH<15> *pSVar7;
  int i;
  long lVar8;
  SH<15> *pSVar9;
  undefined8 *puVar10;
  long lVar11;
  pointer pSVar12;
  float fVar13;
  float fVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar16;
  vec3f w;
  SymmSH<15> symmlog;
  SymmSH<15> c_1;
  SymmSH<15> c;
  SymmSH<15> local_7d8;
  undefined1 local_798 [8];
  float fStack_790;
  float fStack_78c;
  float local_788;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> local_760;
  SH<15> local_748;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined4 uStack_390;
  undefined4 local_38c;
  undefined4 uStack_388;
  undefined8 uStack_384;
  
  fStack_790 = (float)in_XMM0_Dc;
  local_798 = cluster_center._0_8_;
  fStack_78c = (float)in_XMM0_Dd;
  if ((log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init == '\0') &&
     (iVar5 = __cxa_guard_acquire(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)
                                   ::init), iVar5 != 0)) {
    anon_unknown.dwarf_3bba2::loadlut_cpu();
    __cxa_guard_release(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init);
  }
  memset(__return_storage_ptr__,0,900);
  pSVar12 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar3 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar12 != pSVar3) {
    do {
      uVar1 = (pSVar12->center).x;
      uVar2 = (pSVar12->center).y;
      local_778 = (float)uVar1 - (float)local_798._0_4_;
      fStack_774 = (float)uVar2 - (float)local_798._4_4_;
      fStack_770 = 0.0 - fStack_790;
      fStack_76c = 0.0 - fStack_78c;
      fVar16 = (pSVar12->center).z - cluster_center.z;
      fVar13 = SQRT(fVar16 * fVar16 + local_778 * local_778 + fStack_774 * fStack_774);
      fVar15 = pSVar12->radius / fVar13;
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      local_788 = asinf(fVar14);
      std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::vector
                (&local_760,
                 (vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)&(anonymous_namespace)::log_lut
                );
      fVar14 = (float)(((long)local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x1111111111111111
                      - 1);
      fVar15 = (local_788 / (PI * 0.5)) * fVar14;
      if (fVar15 <= 0.0) {
        local_7d8.a._0_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start)->a;
        local_7d8.a._8_8_ =
             *(undefined8 *)
              ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start)->a + 2);
        local_7d8.a._16_8_ =
             *(undefined8 *)
              ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start)->a + 4);
        local_7d8.a._24_8_ =
             *(undefined8 *)
              ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start)->a + 6);
        local_7d8.a._32_8_ =
             *(undefined8 *)
              ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start)->a + 8);
        local_7d8.a._52_8_ =
             *(undefined8 *)
              ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start)->a + 0xd);
        local_7d8.a[0xc] =
             (float)((ulong)*(undefined8 *)
                             ((local_760.
                               super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                               super__Vector_impl_data._M_start)->a + 0xb) >> 0x20);
        local_7d8.a[10] =
             (float)*(undefined8 *)
                     ((local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->a + 10);
        local_7d8.a[0xb] =
             (float)((ulong)*(undefined8 *)
                             ((local_760.
                               super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                               super__Vector_impl_data._M_start)->a + 10) >> 0x20);
LAB_0015885c:
        operator_delete(local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      else {
        if (fVar14 <= fVar15) {
          local_7d8.a._0_8_ =
               *(undefined8 *)
                local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].a;
          local_7d8.a._8_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].a + 2);
          local_7d8.a._16_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].a + 4);
          local_7d8.a._24_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].a + 6);
          local_7d8.a._32_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].a + 8);
          local_7d8.a._52_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].a + 0xd);
          local_7d8.a[0xc] =
               (float)((ulong)*(undefined8 *)
                               (local_760.
                                super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                                .super__Vector_impl_data._M_finish[-1].a + 0xb) >> 0x20);
          local_7d8.a[10] =
               (float)*(undefined8 *)
                       (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].a + 10);
          local_7d8.a[0xb] =
               (float)((ulong)*(undefined8 *)
                               (local_760.
                                super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                                .super__Vector_impl_data._M_finish[-1].a + 10) >> 0x20);
        }
        else {
          lVar6 = (long)(int)fVar15;
          uVar4 = *(undefined8 *)
                   (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6].a + 8 + 2);
          uStack_388 = (undefined4)
                       ((ulong)*(undefined8 *)
                                (local_760.
                                 super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar6].a + 0xb) >> 0x20);
          uStack_384 = *(undefined8 *)
                        (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6].a + 0xb + 2);
          uStack_398 = *(undefined8 *)
                        (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6].a + 8);
          uStack_390 = (undefined4)uVar4;
          local_38c = (undefined4)((ulong)uVar4 >> 0x20);
          local_3a8 = *(undefined8 *)
                       (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6].a + 4);
          uStack_3a0 = *(undefined8 *)
                        (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6].a + 4 + 2);
          local_3b8 = *(undefined8 *)
                       local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar6].a;
          uStack_3b0 = *(undefined8 *)
                        (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6].a + 2);
          lVar8 = 0;
          do {
            *(float *)((long)&local_3b8 + lVar8 * 4) =
                 *(float *)((long)&local_3b8 + lVar8 * 4) * (1.0 - (fVar15 - (float)(int)fVar15));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0xf);
          local_748.a[0xc] =
               (float)((ulong)*(undefined8 *)
                               (local_760.
                                super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar6 + 1].a + 0xb) >> 0x20);
          local_748.a._52_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + 1].a + 0xd);
          local_748.a._32_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + 1].a + 8);
          local_748.a[10] =
               (float)*(undefined8 *)
                       (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6 + 1].a + 10);
          local_748.a[0xb] =
               (float)((ulong)*(undefined8 *)
                               (local_760.
                                super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar6 + 1].a + 10) >> 0x20);
          local_748.a._16_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + 1].a + 4);
          local_748.a._24_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + 1].a + 6);
          local_748.a._0_8_ =
               *(undefined8 *)
                local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + 1].a;
          local_748.a._8_8_ =
               *(undefined8 *)
                (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + 1].a + 2);
          lVar6 = 0;
          do {
            local_748.a[lVar6] = local_748.a[lVar6] * (fVar15 - (float)(int)fVar15);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0xf);
          local_7d8.a[0xc] = 0.0;
          local_7d8.a[0xd] = 0.0;
          local_7d8.a[0xe] = 0.0;
          local_7d8.a[8] = 0.0;
          local_7d8.a[9] = 0.0;
          local_7d8.a[10] = 0.0;
          local_7d8.a[0xb] = 0.0;
          local_7d8.a[4] = 0.0;
          local_7d8.a[5] = 0.0;
          local_7d8.a[6] = 0.0;
          local_7d8.a[7] = 0.0;
          local_7d8.a[0] = 0.0;
          local_7d8.a[1] = 0.0;
          local_7d8.a[2] = 0.0;
          local_7d8.a[3] = 0.0;
          lVar6 = 0;
          do {
            local_7d8.a[lVar6] = *(float *)((long)&local_3b8 + lVar6 * 4) + local_748.a[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0xf);
        }
        if (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0015885c;
      }
      fVar13 = 1.0 / fVar13;
      w.z = fVar16 * fVar13;
      w.x = local_778 * fVar13;
      w.y = fStack_774 * fVar13;
      SymmSH<15>::rotated(&local_748,&local_7d8,w);
      memset(&local_3b8,0,900);
      lVar6 = 4;
      lVar8 = 0;
      pSVar7 = __return_storage_ptr__;
      pSVar9 = &local_748;
      puVar10 = &local_3b8;
      do {
        lVar8 = lVar8 + 1;
        lVar11 = 0;
        do {
          *(float *)((long)puVar10 + lVar11) =
               *(float *)((long)pSVar7->a + lVar11) + *(float *)((long)pSVar9->a + lVar11);
          lVar11 = lVar11 + 4;
        } while (lVar6 != lVar11);
        puVar10 = (undefined8 *)((long)puVar10 + lVar6);
        pSVar9 = (SH<15> *)((long)pSVar9->a + lVar6);
        pSVar7 = (SH<15> *)((long)pSVar7->a + lVar6);
        lVar6 = lVar6 + 8;
      } while (lVar8 != 0xf);
      memcpy(__return_storage_ptr__,&local_3b8,900);
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 != pSVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

SH<shorder> log_visibility(vec3f cluster_center, std::vector<Sphere> blockers)
{
	static int init = loadlut_cpu();
	SH<shorder> f;
	for (Sphere sph: blockers)
	{
        vec3f v = sph.center - cluster_center;
        float angle = asin(std::min(sph.radius / norm(v), 1.0f));
        SymmSH<shorder> symmlog = log_lookup(angle);
        f = f + symmlog.rotated(normalized(v));
	}
	return f;
}